

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter.h
# Opt level: O1

string * __thiscall Unary::toString_abi_cxx11_(string *__return_storage_ptr__,Unary *this)

{
  size_type *psVar1;
  undefined8 uVar2;
  long *plVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  ulong uVar6;
  ulong *local_78;
  long local_70;
  ulong local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  ulong *local_58;
  long local_50;
  ulong local_48 [2];
  long *local_38 [2];
  long local_28 [2];
  
  (**((this->super_Op).super_Expr.op.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_Token)(local_38);
  plVar3 = (long *)std::__cxx11::string::append((char *)local_38);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_68 = *puVar5;
    uStack_60 = (undefined4)plVar3[3];
    uStack_5c = *(undefined4 *)((long)plVar3 + 0x1c);
    local_78 = &local_68;
  }
  else {
    local_68 = *puVar5;
    local_78 = (ulong *)*plVar3;
  }
  local_70 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  (*(((this->expr).super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_Node).
    _vptr_Node[6])(&local_58);
  uVar6 = 0xf;
  if (local_78 != &local_68) {
    uVar6 = local_68;
  }
  if (uVar6 < (ulong)(local_50 + local_70)) {
    uVar6 = 0xf;
    if (local_58 != local_48) {
      uVar6 = local_48[0];
    }
    if ((ulong)(local_50 + local_70) <= uVar6) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_78);
      goto LAB_0010edb2;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_58);
LAB_0010edb2:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar1) {
    uVar2 = puVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toString() override {
		return op->toString() + " " + expr->toString();
	}